

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTextureTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::SparseTextureCommitmentTestCase::isPageSizesMultiplication
          (SparseTextureCommitmentTestCase *this,GLint target,GLint level)

{
  int local_2c;
  GLint widthCommitted;
  GLint depth;
  GLint height;
  GLint width;
  GLint level_local;
  GLint target_local;
  SparseTextureCommitmentTestCase *this_local;
  
  height = level;
  width = target;
  _level_local = this;
  SparseTextureUtils::getTextureLevelSize
            (target,&this->mState,level,&depth,&widthCommitted,&local_2c);
  if (width == 0x8513) {
    local_2c = local_2c * 6;
  }
  if ((((depth / 2) % (this->mState).pageSizeX == 0) &&
      (widthCommitted % (this->mState).pageSizeY == 0)) &&
     (local_2c % (this->mState).pageSizeZ == 0)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SparseTextureCommitmentTestCase::isPageSizesMultiplication(GLint target, GLint level)
{
	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	if (target == GL_TEXTURE_CUBE_MAP)
		depth = 6 * depth;

	GLint widthCommitted = width / 2;
	if ((widthCommitted % mState.pageSizeX) == 0 && (height % mState.pageSizeY) == 0 && (depth % mState.pageSizeZ) == 0)
	{
		return true;
	}

	return false;
}